

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O0

void google::protobuf::protobuf_AddDesc_google_2fprotobuf_2fdescriptor_2eproto(void)

{
  FileDescriptorSet *this;
  FileDescriptorProto *this_00;
  DescriptorProto *this_01;
  DescriptorProto_ExtensionRange *this_02;
  FieldDescriptorProto *this_03;
  EnumDescriptorProto *this_04;
  EnumValueDescriptorProto *this_05;
  ServiceDescriptorProto *this_06;
  MethodDescriptorProto *this_07;
  FileOptions *this_08;
  MessageOptions *this_09;
  FieldOptions *this_10;
  EnumOptions *this_11;
  EnumValueOptions *this_12;
  ServiceOptions *this_13;
  MethodOptions *this_14;
  UninterpretedOption *this_15;
  UninterpretedOption_NamePart *this_16;
  SourceCodeInfo *this_17;
  SourceCodeInfo_Location *this_18;
  
  if (!protobuf_AddDesc_google_2fprotobuf_2fdescriptor_2eproto::already_here) {
    protobuf_AddDesc_google_2fprotobuf_2fdescriptor_2eproto::already_here = true;
    internal::VerifyVersion
              (0x1e9809,0x1e9809,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/chai2010[P]protorpc/src/google/protobuf/descriptor.pb.cc"
              );
    DescriptorPool::InternalAddGeneratedFile(anon_var_dwarf_1e4ef7,0x1027);
    MessageFactory::InternalRegisterGeneratedFile
              ("google/protobuf/descriptor.proto",anon_unknown_54::protobuf_RegisterTypes);
    this = (FileDescriptorSet *)operator_new(0x30);
    FileDescriptorSet::FileDescriptorSet(this);
    FileDescriptorSet::default_instance_ = this;
    this_00 = (FileDescriptorProto *)operator_new(0xd0);
    FileDescriptorProto::FileDescriptorProto(this_00);
    FileDescriptorProto::default_instance_ = this_00;
    this_01 = (DescriptorProto *)operator_new(0xa0);
    DescriptorProto::DescriptorProto(this_01);
    DescriptorProto::default_instance_ = this_01;
    this_02 = (DescriptorProto_ExtensionRange *)operator_new(0x20);
    DescriptorProto_ExtensionRange::DescriptorProto_ExtensionRange(this_02);
    DescriptorProto_ExtensionRange::default_instance_ = this_02;
    this_03 = (FieldDescriptorProto *)operator_new(0x50);
    FieldDescriptorProto::FieldDescriptorProto(this_03);
    FieldDescriptorProto::default_instance_ = this_03;
    this_04 = (EnumDescriptorProto *)operator_new(0x40);
    EnumDescriptorProto::EnumDescriptorProto(this_04);
    EnumDescriptorProto::default_instance_ = this_04;
    this_05 = (EnumValueDescriptorProto *)operator_new(0x30);
    EnumValueDescriptorProto::EnumValueDescriptorProto(this_05);
    EnumValueDescriptorProto::default_instance_ = this_05;
    this_06 = (ServiceDescriptorProto *)operator_new(0x40);
    ServiceDescriptorProto::ServiceDescriptorProto(this_06);
    ServiceDescriptorProto::default_instance_ = this_06;
    this_07 = (MethodDescriptorProto *)operator_new(0x38);
    MethodDescriptorProto::MethodDescriptorProto(this_07);
    MethodDescriptorProto::default_instance_ = this_07;
    this_08 = (FileOptions *)operator_new(0x88);
    FileOptions::FileOptions(this_08);
    FileOptions::default_instance_ = this_08;
    this_09 = (MessageOptions *)operator_new(0x68);
    MessageOptions::MessageOptions(this_09);
    MessageOptions::default_instance_ = this_09;
    this_10 = (FieldOptions *)operator_new(0x70);
    FieldOptions::FieldOptions(this_10);
    FieldOptions::default_instance_ = this_10;
    this_11 = (EnumOptions *)operator_new(0x68);
    EnumOptions::EnumOptions(this_11);
    EnumOptions::default_instance_ = this_11;
    this_12 = (EnumValueOptions *)operator_new(0x60);
    EnumValueOptions::EnumValueOptions(this_12);
    EnumValueOptions::default_instance_ = this_12;
    this_13 = (ServiceOptions *)operator_new(0x60);
    ServiceOptions::ServiceOptions(this_13);
    ServiceOptions::default_instance_ = this_13;
    this_14 = (MethodOptions *)operator_new(0x60);
    MethodOptions::MethodOptions(this_14);
    MethodOptions::default_instance_ = this_14;
    this_15 = (UninterpretedOption *)operator_new(0x60);
    UninterpretedOption::UninterpretedOption(this_15);
    UninterpretedOption::default_instance_ = this_15;
    this_16 = (UninterpretedOption_NamePart *)operator_new(0x28);
    UninterpretedOption_NamePart::UninterpretedOption_NamePart(this_16);
    UninterpretedOption_NamePart::default_instance_ = this_16;
    this_17 = (SourceCodeInfo *)operator_new(0x30);
    SourceCodeInfo::SourceCodeInfo(this_17);
    SourceCodeInfo::default_instance_ = this_17;
    this_18 = (SourceCodeInfo_Location *)operator_new(0x58);
    SourceCodeInfo_Location::SourceCodeInfo_Location(this_18);
    SourceCodeInfo_Location::default_instance_ = this_18;
    FileDescriptorSet::InitAsDefaultInstance(FileDescriptorSet::default_instance_);
    FileDescriptorProto::InitAsDefaultInstance(FileDescriptorProto::default_instance_);
    DescriptorProto::InitAsDefaultInstance(DescriptorProto::default_instance_);
    DescriptorProto_ExtensionRange::InitAsDefaultInstance
              (DescriptorProto_ExtensionRange::default_instance_);
    FieldDescriptorProto::InitAsDefaultInstance(FieldDescriptorProto::default_instance_);
    EnumDescriptorProto::InitAsDefaultInstance(EnumDescriptorProto::default_instance_);
    EnumValueDescriptorProto::InitAsDefaultInstance(EnumValueDescriptorProto::default_instance_);
    ServiceDescriptorProto::InitAsDefaultInstance(ServiceDescriptorProto::default_instance_);
    MethodDescriptorProto::InitAsDefaultInstance(MethodDescriptorProto::default_instance_);
    FileOptions::InitAsDefaultInstance(FileOptions::default_instance_);
    MessageOptions::InitAsDefaultInstance(MessageOptions::default_instance_);
    FieldOptions::InitAsDefaultInstance(FieldOptions::default_instance_);
    EnumOptions::InitAsDefaultInstance(EnumOptions::default_instance_);
    EnumValueOptions::InitAsDefaultInstance(EnumValueOptions::default_instance_);
    ServiceOptions::InitAsDefaultInstance(ServiceOptions::default_instance_);
    MethodOptions::InitAsDefaultInstance(MethodOptions::default_instance_);
    UninterpretedOption::InitAsDefaultInstance(UninterpretedOption::default_instance_);
    UninterpretedOption_NamePart::InitAsDefaultInstance
              (UninterpretedOption_NamePart::default_instance_);
    SourceCodeInfo::InitAsDefaultInstance(SourceCodeInfo::default_instance_);
    SourceCodeInfo_Location::InitAsDefaultInstance(SourceCodeInfo_Location::default_instance_);
    internal::OnShutdown(protobuf_ShutdownFile_google_2fprotobuf_2fdescriptor_2eproto);
  }
  return;
}

Assistant:

void protobuf_AddDesc_google_2fprotobuf_2fdescriptor_2eproto() {
  static bool already_here = false;
  if (already_here) return;
  already_here = true;
  GOOGLE_PROTOBUF_VERIFY_VERSION;

  ::google::protobuf::DescriptorPool::InternalAddGeneratedFile(
    "\n google/protobuf/descriptor.proto\022\017goog"
    "le.protobuf\"G\n\021FileDescriptorSet\0222\n\004file"
    "\030\001 \003(\0132$.google.protobuf.FileDescriptorP"
    "roto\"\313\003\n\023FileDescriptorProto\022\014\n\004name\030\001 \001"
    "(\t\022\017\n\007package\030\002 \001(\t\022\022\n\ndependency\030\003 \003(\t\022"
    "\031\n\021public_dependency\030\n \003(\005\022\027\n\017weak_depen"
    "dency\030\013 \003(\005\0226\n\014message_type\030\004 \003(\0132 .goog"
    "le.protobuf.DescriptorProto\0227\n\tenum_type"
    "\030\005 \003(\0132$.google.protobuf.EnumDescriptorP"
    "roto\0228\n\007service\030\006 \003(\0132\'.google.protobuf."
    "ServiceDescriptorProto\0228\n\textension\030\007 \003("
    "\0132%.google.protobuf.FieldDescriptorProto"
    "\022-\n\007options\030\010 \001(\0132\034.google.protobuf.File"
    "Options\0229\n\020source_code_info\030\t \001(\0132\037.goog"
    "le.protobuf.SourceCodeInfo\"\251\003\n\017Descripto"
    "rProto\022\014\n\004name\030\001 \001(\t\0224\n\005field\030\002 \003(\0132%.go"
    "ogle.protobuf.FieldDescriptorProto\0228\n\tex"
    "tension\030\006 \003(\0132%.google.protobuf.FieldDes"
    "criptorProto\0225\n\013nested_type\030\003 \003(\0132 .goog"
    "le.protobuf.DescriptorProto\0227\n\tenum_type"
    "\030\004 \003(\0132$.google.protobuf.EnumDescriptorP"
    "roto\022H\n\017extension_range\030\005 \003(\0132/.google.p"
    "rotobuf.DescriptorProto.ExtensionRange\0220"
    "\n\007options\030\007 \001(\0132\037.google.protobuf.Messag"
    "eOptions\032,\n\016ExtensionRange\022\r\n\005start\030\001 \001("
    "\005\022\013\n\003end\030\002 \001(\005\"\224\005\n\024FieldDescriptorProto\022"
    "\014\n\004name\030\001 \001(\t\022\016\n\006number\030\003 \001(\005\022:\n\005label\030\004"
    " \001(\0162+.google.protobuf.FieldDescriptorPr"
    "oto.Label\0228\n\004type\030\005 \001(\0162*.google.protobu"
    "f.FieldDescriptorProto.Type\022\021\n\ttype_name"
    "\030\006 \001(\t\022\020\n\010extendee\030\002 \001(\t\022\025\n\rdefault_valu"
    "e\030\007 \001(\t\022.\n\007options\030\010 \001(\0132\035.google.protob"
    "uf.FieldOptions\"\266\002\n\004Type\022\017\n\013TYPE_DOUBLE\020"
    "\001\022\016\n\nTYPE_FLOAT\020\002\022\016\n\nTYPE_INT64\020\003\022\017\n\013TYP"
    "E_UINT64\020\004\022\016\n\nTYPE_INT32\020\005\022\020\n\014TYPE_FIXED"
    "64\020\006\022\020\n\014TYPE_FIXED32\020\007\022\r\n\tTYPE_BOOL\020\010\022\017\n"
    "\013TYPE_STRING\020\t\022\016\n\nTYPE_GROUP\020\n\022\020\n\014TYPE_M"
    "ESSAGE\020\013\022\016\n\nTYPE_BYTES\020\014\022\017\n\013TYPE_UINT32\020"
    "\r\022\r\n\tTYPE_ENUM\020\016\022\021\n\rTYPE_SFIXED32\020\017\022\021\n\rT"
    "YPE_SFIXED64\020\020\022\017\n\013TYPE_SINT32\020\021\022\017\n\013TYPE_"
    "SINT64\020\022\"C\n\005Label\022\022\n\016LABEL_OPTIONAL\020\001\022\022\n"
    "\016LABEL_REQUIRED\020\002\022\022\n\016LABEL_REPEATED\020\003\"\214\001"
    "\n\023EnumDescriptorProto\022\014\n\004name\030\001 \001(\t\0228\n\005v"
    "alue\030\002 \003(\0132).google.protobuf.EnumValueDe"
    "scriptorProto\022-\n\007options\030\003 \001(\0132\034.google."
    "protobuf.EnumOptions\"l\n\030EnumValueDescrip"
    "torProto\022\014\n\004name\030\001 \001(\t\022\016\n\006number\030\002 \001(\005\0222"
    "\n\007options\030\003 \001(\0132!.google.protobuf.EnumVa"
    "lueOptions\"\220\001\n\026ServiceDescriptorProto\022\014\n"
    "\004name\030\001 \001(\t\0226\n\006method\030\002 \003(\0132&.google.pro"
    "tobuf.MethodDescriptorProto\0220\n\007options\030\003"
    " \001(\0132\037.google.protobuf.ServiceOptions\"\177\n"
    "\025MethodDescriptorProto\022\014\n\004name\030\001 \001(\t\022\022\n\n"
    "input_type\030\002 \001(\t\022\023\n\013output_type\030\003 \001(\t\022/\n"
    "\007options\030\004 \001(\0132\036.google.protobuf.MethodO"
    "ptions\"\351\003\n\013FileOptions\022\024\n\014java_package\030\001"
    " \001(\t\022\034\n\024java_outer_classname\030\010 \001(\t\022\"\n\023ja"
    "va_multiple_files\030\n \001(\010:\005false\022,\n\035java_g"
    "enerate_equals_and_hash\030\024 \001(\010:\005false\022F\n\014"
    "optimize_for\030\t \001(\0162).google.protobuf.Fil"
    "eOptions.OptimizeMode:\005SPEED\022\022\n\ngo_packa"
    "ge\030\013 \001(\t\022\"\n\023cc_generic_services\030\020 \001(\010:\005f"
    "alse\022$\n\025java_generic_services\030\021 \001(\010:\005fal"
    "se\022\"\n\023py_generic_services\030\022 \001(\010:\005false\022C"
    "\n\024uninterpreted_option\030\347\007 \003(\0132$.google.p"
    "rotobuf.UninterpretedOption\":\n\014OptimizeM"
    "ode\022\t\n\005SPEED\020\001\022\r\n\tCODE_SIZE\020\002\022\020\n\014LITE_RU"
    "NTIME\020\003*\t\010\350\007\020\200\200\200\200\002\"\270\001\n\016MessageOptions\022&\n"
    "\027message_set_wire_format\030\001 \001(\010:\005false\022.\n"
    "\037no_standard_descriptor_accessor\030\002 \001(\010:\005"
    "false\022C\n\024uninterpreted_option\030\347\007 \003(\0132$.g"
    "oogle.protobuf.UninterpretedOption*\t\010\350\007\020"
    "\200\200\200\200\002\"\276\002\n\014FieldOptions\022:\n\005ctype\030\001 \001(\0162#."
    "google.protobuf.FieldOptions.CType:\006STRI"
    "NG\022\016\n\006packed\030\002 \001(\010\022\023\n\004lazy\030\005 \001(\010:\005false\022"
    "\031\n\ndeprecated\030\003 \001(\010:\005false\022\034\n\024experiment"
    "al_map_key\030\t \001(\t\022\023\n\004weak\030\n \001(\010:\005false\022C\n"
    "\024uninterpreted_option\030\347\007 \003(\0132$.google.pr"
    "otobuf.UninterpretedOption\"/\n\005CType\022\n\n\006S"
    "TRING\020\000\022\010\n\004CORD\020\001\022\020\n\014STRING_PIECE\020\002*\t\010\350\007"
    "\020\200\200\200\200\002\"x\n\013EnumOptions\022\031\n\013allow_alias\030\002 \001"
    "(\010:\004true\022C\n\024uninterpreted_option\030\347\007 \003(\0132"
    "$.google.protobuf.UninterpretedOption*\t\010"
    "\350\007\020\200\200\200\200\002\"b\n\020EnumValueOptions\022C\n\024uninterp"
    "reted_option\030\347\007 \003(\0132$.google.protobuf.Un"
    "interpretedOption*\t\010\350\007\020\200\200\200\200\002\"`\n\016ServiceO"
    "ptions\022C\n\024uninterpreted_option\030\347\007 \003(\0132$."
    "google.protobuf.UninterpretedOption*\t\010\350\007"
    "\020\200\200\200\200\002\"_\n\rMethodOptions\022C\n\024uninterpreted"
    "_option\030\347\007 \003(\0132$.google.protobuf.Uninter"
    "pretedOption*\t\010\350\007\020\200\200\200\200\002\"\236\002\n\023Uninterprete"
    "dOption\022;\n\004name\030\002 \003(\0132-.google.protobuf."
    "UninterpretedOption.NamePart\022\030\n\020identifi"
    "er_value\030\003 \001(\t\022\032\n\022positive_int_value\030\004 \001"
    "(\004\022\032\n\022negative_int_value\030\005 \001(\003\022\024\n\014double"
    "_value\030\006 \001(\001\022\024\n\014string_value\030\007 \001(\014\022\027\n\017ag"
    "gregate_value\030\010 \001(\t\0323\n\010NamePart\022\021\n\tname_"
    "part\030\001 \002(\t\022\024\n\014is_extension\030\002 \002(\010\"\261\001\n\016Sou"
    "rceCodeInfo\022:\n\010location\030\001 \003(\0132(.google.p"
    "rotobuf.SourceCodeInfo.Location\032c\n\010Locat"
    "ion\022\020\n\004path\030\001 \003(\005B\002\020\001\022\020\n\004span\030\002 \003(\005B\002\020\001\022"
    "\030\n\020leading_comments\030\003 \001(\t\022\031\n\021trailing_co"
    "mments\030\004 \001(\tB)\n\023com.google.protobufB\020Des"
    "criptorProtosH\001", 4135);
  ::google::protobuf::MessageFactory::InternalRegisterGeneratedFile(
    "google/protobuf/descriptor.proto", &protobuf_RegisterTypes);
  FileDescriptorSet::default_instance_ = new FileDescriptorSet();
  FileDescriptorProto::default_instance_ = new FileDescriptorProto();
  DescriptorProto::default_instance_ = new DescriptorProto();
  DescriptorProto_ExtensionRange::default_instance_ = new DescriptorProto_ExtensionRange();
  FieldDescriptorProto::default_instance_ = new FieldDescriptorProto();
  EnumDescriptorProto::default_instance_ = new EnumDescriptorProto();
  EnumValueDescriptorProto::default_instance_ = new EnumValueDescriptorProto();
  ServiceDescriptorProto::default_instance_ = new ServiceDescriptorProto();
  MethodDescriptorProto::default_instance_ = new MethodDescriptorProto();
  FileOptions::default_instance_ = new FileOptions();
  MessageOptions::default_instance_ = new MessageOptions();
  FieldOptions::default_instance_ = new FieldOptions();
  EnumOptions::default_instance_ = new EnumOptions();
  EnumValueOptions::default_instance_ = new EnumValueOptions();
  ServiceOptions::default_instance_ = new ServiceOptions();
  MethodOptions::default_instance_ = new MethodOptions();
  UninterpretedOption::default_instance_ = new UninterpretedOption();
  UninterpretedOption_NamePart::default_instance_ = new UninterpretedOption_NamePart();
  SourceCodeInfo::default_instance_ = new SourceCodeInfo();
  SourceCodeInfo_Location::default_instance_ = new SourceCodeInfo_Location();
  FileDescriptorSet::default_instance_->InitAsDefaultInstance();
  FileDescriptorProto::default_instance_->InitAsDefaultInstance();
  DescriptorProto::default_instance_->InitAsDefaultInstance();
  DescriptorProto_ExtensionRange::default_instance_->InitAsDefaultInstance();
  FieldDescriptorProto::default_instance_->InitAsDefaultInstance();
  EnumDescriptorProto::default_instance_->InitAsDefaultInstance();
  EnumValueDescriptorProto::default_instance_->InitAsDefaultInstance();
  ServiceDescriptorProto::default_instance_->InitAsDefaultInstance();
  MethodDescriptorProto::default_instance_->InitAsDefaultInstance();
  FileOptions::default_instance_->InitAsDefaultInstance();
  MessageOptions::default_instance_->InitAsDefaultInstance();
  FieldOptions::default_instance_->InitAsDefaultInstance();
  EnumOptions::default_instance_->InitAsDefaultInstance();
  EnumValueOptions::default_instance_->InitAsDefaultInstance();
  ServiceOptions::default_instance_->InitAsDefaultInstance();
  MethodOptions::default_instance_->InitAsDefaultInstance();
  UninterpretedOption::default_instance_->InitAsDefaultInstance();
  UninterpretedOption_NamePart::default_instance_->InitAsDefaultInstance();
  SourceCodeInfo::default_instance_->InitAsDefaultInstance();
  SourceCodeInfo_Location::default_instance_->InitAsDefaultInstance();
  ::google::protobuf::internal::OnShutdown(&protobuf_ShutdownFile_google_2fprotobuf_2fdescriptor_2eproto);
}